

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

void __thiscall
wabt::Module::AppendField
          (Module *this,
          unique_ptr<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>
          *field)

{
  FuncType *pFVar1;
  size_t *psVar2;
  pointer *pppFVar3;
  FuncTypeModuleField *pFVar4;
  iterator __position;
  ModuleField *pMVar5;
  ModuleFieldList *pMVar6;
  FuncType *local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  int local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  
  pFVar4 = (field->_M_t).
           super___uniq_ptr_impl<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::FuncTypeModuleField_*,_std::default_delete<wabt::FuncTypeModuleField>_>
           .super__Head_base<0UL,_wabt::FuncTypeModuleField_*,_false>._M_head_impl;
  pFVar1 = &pFVar4->func_type;
  if (*(size_type *)((long)&(pFVar4->func_type).name + 8) != 0) {
    local_48 = (FuncType *)
               (((Location *)
                ((long)&(pFVar4->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField
                + 0x18))->filename).data_;
    uStack_40 = *(undefined4 *)
                 ((long)&(pFVar4->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).
                         super_ModuleField + 0x20);
    uStack_3c = *(undefined4 *)
                 ((long)&(pFVar4->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).
                         super_ModuleField + 0x24);
    local_38 = (((anon_union_16_2_ecfd7102_for_Location_1 *)
                ((long)&(pFVar4->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField
                + 0x28))->field_0).line;
    uStack_34 = *(undefined4 *)
                 ((long)&(pFVar4->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).
                         super_ModuleField + 0x2c);
    uStack_30 = *(undefined4 *)
                 ((long)&(pFVar4->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).
                         super_ModuleField + 0x30);
    uStack_2c = *(undefined4 *)
                 ((long)&(pFVar4->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).
                         super_ModuleField + 0x34);
    local_28 = (undefined4)
               ((ulong)((long)(this->func_types).
                              super__Vector_base<wabt::FuncType_*,_std::allocator<wabt::FuncType_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->func_types).
                             super__Vector_base<wabt::FuncType_*,_std::allocator<wabt::FuncType_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
    ::_M_emplace<std::__cxx11::string&,wabt::Binding>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                *)&this->func_type_bindings,0,pFVar1);
  }
  __position._M_current =
       (this->func_types).super__Vector_base<wabt::FuncType_*,_std::allocator<wabt::FuncType_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_48 = pFVar1;
  if (__position._M_current ==
      (this->func_types).super__Vector_base<wabt::FuncType_*,_std::allocator<wabt::FuncType_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<wabt::FuncType*,std::allocator<wabt::FuncType*>>::_M_realloc_insert<wabt::FuncType*>
              ((vector<wabt::FuncType*,std::allocator<wabt::FuncType*>> *)&this->func_types,
               __position,&local_48);
  }
  else {
    *__position._M_current = pFVar1;
    pppFVar3 = &(this->func_types).
                super__Vector_base<wabt::FuncType_*,_std::allocator<wabt::FuncType_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppFVar3 = *pppFVar3 + 1;
  }
  pFVar4 = (field->_M_t).
           super___uniq_ptr_impl<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::FuncTypeModuleField_*,_std::default_delete<wabt::FuncTypeModuleField>_>
           .super__Head_base<0UL,_wabt::FuncTypeModuleField_*,_false>._M_head_impl;
  (field->_M_t).
  super___uniq_ptr_impl<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>.
  _M_t.
  super__Tuple_impl<0UL,_wabt::FuncTypeModuleField_*,_std::default_delete<wabt::FuncTypeModuleField>_>
  .super__Head_base<0UL,_wabt::FuncTypeModuleField_*,_false>._M_head_impl =
       (FuncTypeModuleField *)0x0;
  if ((*(ModuleField **)
        ((long)&(pFVar4->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField + 0x10)
       == (ModuleField *)0x0) &&
     (((intrusive_list_base<wabt::ModuleField> *)
      ((long)&(pFVar4->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField + 8))->
      next_ == (ModuleField *)0x0)) {
    pMVar5 = (this->fields).last_;
    if (pMVar5 == (ModuleField *)0x0) {
      pMVar6 = &this->fields;
    }
    else {
      *(ModuleField **)
       ((long)&(pFVar4->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField + 0x10)
           = pMVar5;
      pMVar6 = (ModuleFieldList *)&pMVar5->super_intrusive_list_base<wabt::ModuleField>;
    }
    pMVar6->first_ = (ModuleField *)pFVar4;
    (this->fields).last_ = (ModuleField *)pFVar4;
    psVar2 = &(this->fields).size_;
    *psVar2 = *psVar2 + 1;
    return;
  }
  __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/intrusive-list.h"
                ,0x1bf,
                "void wabt::intrusive_list<wabt::ModuleField>::push_back(std::unique_ptr<T>) [T = wabt::ModuleField]"
               );
}

Assistant:

void Module::AppendField(std::unique_ptr<FuncTypeModuleField> field) {
  FuncType& func_type = field->func_type;
  if (!func_type.name.empty()) {
    func_type_bindings.emplace(func_type.name,
                               Binding(field->loc, func_types.size()));
  }
  func_types.push_back(&func_type);
  fields.push_back(std::move(field));
}